

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

void __thiscall soul::Value::copyValue(Value *this,Value *source)

{
  bool bVar1;
  uint8_t *__dest;
  uint8_t *__src;
  
  bVar1 = Type::isIdentical(&this->type,&source->type);
  if (bVar1) {
    __dest = LazyAllocatedData::data(&this->allocatedData);
    __src = LazyAllocatedData::data(&source->allocatedData);
    memcpy(__dest,__src,(this->allocatedData).allocatedSize);
    return;
  }
  throwInternalCompilerError("copyValue",0x27b);
}

Assistant:

void Value::copyValue (const Value& source)
{
    if (type.isIdentical (source.type))
    {
        memcpy (allocatedData.data(), source.allocatedData.data(), allocatedData.size());
        return;
    }

    SOUL_ASSERT_FALSE;
}